

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O2

BBox3fa * __thiscall
embree::avx512::
CurveGeometryISA<(embree::Geometry::GType)1,_embree::avx512::CurveGeometryInterface,_embree::CatmullRomCurveT>
::vbounds(BBox3fa *__return_storage_ptr__,
         CurveGeometryISA<(embree::Geometry::GType)1,_embree::avx512::CurveGeometryInterface,_embree::CatmullRomCurveT>
         *this,LinearSpace3fa *space,size_t i)

{
  float fVar1;
  undefined4 uVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  uint uVar6;
  BufferView<embree::Vec3fx> *pBVar7;
  char *pcVar8;
  size_t sVar9;
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [12];
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [32];
  
  pBVar7 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
           vertices.items;
  pcVar8 = (pBVar7->super_RawBufferView).ptr_ofs;
  sVar9 = (pBVar7->super_RawBufferView).stride;
  uVar6 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                              super_CurveGeometry.super_Geometry.field_0x58 +
                   i * *(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                                 super_CurveGeometry.field_0x68);
  fVar1 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
          maxRadiusScale;
  lVar23 = uVar6 * sVar9;
  fVar10 = fVar1 * *(float *)(pcVar8 + lVar23 + 0xc);
  auVar44._4_4_ = fVar10;
  auVar44._0_4_ = fVar10;
  auVar44._8_4_ = fVar10;
  auVar44._12_4_ = fVar10;
  auVar44._16_4_ = fVar10;
  auVar44._20_4_ = fVar10;
  auVar44._24_4_ = fVar10;
  auVar44._28_4_ = fVar10;
  lVar20 = (uVar6 + 1) * sVar9;
  fVar10 = fVar1 * *(float *)(pcVar8 + lVar20 + 0xc);
  auVar30._4_4_ = fVar10;
  auVar30._0_4_ = fVar10;
  auVar30._8_4_ = fVar10;
  auVar30._12_4_ = fVar10;
  auVar30._16_4_ = fVar10;
  auVar30._20_4_ = fVar10;
  auVar30._24_4_ = fVar10;
  auVar30._28_4_ = fVar10;
  lVar21 = (uVar6 + 2) * sVar9;
  fVar10 = fVar1 * *(float *)(pcVar8 + lVar21 + 0xc);
  auVar31._4_4_ = fVar10;
  auVar31._0_4_ = fVar10;
  auVar31._8_4_ = fVar10;
  auVar31._12_4_ = fVar10;
  auVar31._16_4_ = fVar10;
  auVar31._20_4_ = fVar10;
  auVar31._24_4_ = fVar10;
  auVar31._28_4_ = fVar10;
  lVar22 = (uVar6 + 3) * sVar9;
  fVar1 = fVar1 * *(float *)(pcVar8 + lVar22 + 0xc);
  auVar28._0_4_ = fVar1 * catmullrom_basis0._3944_4_;
  auVar28._4_4_ = fVar1 * catmullrom_basis0._3948_4_;
  auVar28._8_4_ = fVar1 * catmullrom_basis0._3952_4_;
  auVar28._12_4_ = fVar1 * catmullrom_basis0._3956_4_;
  auVar28._16_4_ = fVar1 * catmullrom_basis0._3960_4_;
  auVar28._20_4_ = fVar1 * catmullrom_basis0._3964_4_;
  auVar28._24_4_ = fVar1 * catmullrom_basis0._3968_4_;
  auVar28._28_4_ = 0;
  auVar46 = vfmadd231ps_fma(auVar28,catmullrom_basis0._2788_32_,auVar31);
  auVar46 = vfmadd231ps_fma(ZEXT1632(auVar46),catmullrom_basis0._1632_32_,auVar30);
  auVar46 = vfmadd231ps_fma(ZEXT1632(auVar46),catmullrom_basis0._476_32_,auVar44);
  auVar28 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
  auVar29 = vmaxps_avx512vl(auVar28,ZEXT1632(auVar46));
  auVar33._4_4_ = catmullrom_basis0._8572_4_ * fVar1;
  auVar33._0_4_ = catmullrom_basis0._8568_4_ * fVar1;
  auVar33._8_4_ = catmullrom_basis0._8576_4_ * fVar1;
  auVar33._12_4_ = catmullrom_basis0._8580_4_ * fVar1;
  auVar33._16_4_ = catmullrom_basis0._8584_4_ * fVar1;
  auVar33._20_4_ = catmullrom_basis0._8588_4_ * fVar1;
  auVar33._24_4_ = catmullrom_basis0._8592_4_ * fVar1;
  auVar33._28_4_ = fVar1;
  auVar24 = vfmadd231ps_fma(auVar33,catmullrom_basis0._7412_32_,auVar31);
  auVar24 = vfmadd231ps_fma(ZEXT1632(auVar24),catmullrom_basis0._6256_32_,auVar30);
  auVar24 = vfmadd231ps_fma(ZEXT1632(auVar24),catmullrom_basis0._5100_32_,auVar44);
  auVar30 = vbroadcastss_avx512vl(ZEXT416(0x3d638e39));
  auVar31 = vmulps_avx512vl(ZEXT1632(auVar24),auVar30);
  auVar19 = ZEXT412(0);
  auVar33 = vblendps_avx(auVar31,ZEXT1232(auVar19) << 0x20,1);
  auVar44 = vsubps_avx(ZEXT1632(auVar46),auVar33);
  auVar33 = vblendps_avx(auVar31,ZEXT1232(auVar19) << 0x20,0x80);
  auVar49._0_4_ = auVar46._0_4_ + auVar33._0_4_;
  auVar49._4_4_ = auVar46._4_4_ + auVar33._4_4_;
  auVar49._8_4_ = auVar46._8_4_ + auVar33._8_4_;
  auVar49._12_4_ = auVar46._12_4_ + auVar33._12_4_;
  auVar49._16_4_ = auVar33._16_4_ + 0.0;
  auVar49._20_4_ = auVar33._20_4_ + 0.0;
  auVar49._24_4_ = auVar33._24_4_ + 0.0;
  auVar49._28_4_ = auVar33._28_4_ + 0.0;
  auVar33 = vmaxps_avx(auVar44,auVar49);
  auVar32 = vmaxps_avx512vl(auVar29,auVar33);
  aVar3 = (space->vx).field_0;
  aVar4 = (space->vy).field_0;
  aVar5 = (space->vz).field_0;
  uVar2 = *(undefined4 *)(pcVar8 + lVar23 + 8);
  auVar24._4_4_ = uVar2;
  auVar24._0_4_ = uVar2;
  auVar24._8_4_ = uVar2;
  auVar24._12_4_ = uVar2;
  auVar24 = vmulps_avx512vl((undefined1  [16])aVar5,auVar24);
  uVar2 = *(undefined4 *)(pcVar8 + lVar23 + 4);
  auVar25._4_4_ = uVar2;
  auVar25._0_4_ = uVar2;
  auVar25._8_4_ = uVar2;
  auVar25._12_4_ = uVar2;
  auVar24 = vfmadd231ps_avx512vl(auVar24,(undefined1  [16])aVar4,auVar25);
  uVar2 = *(undefined4 *)(pcVar8 + lVar23);
  auVar26._4_4_ = uVar2;
  auVar26._0_4_ = uVar2;
  auVar26._8_4_ = uVar2;
  auVar26._12_4_ = uVar2;
  auVar24 = vfmadd231ps_avx512vl(auVar24,(undefined1  [16])aVar3,auVar26);
  auVar33 = vbroadcastss_avx512vl(ZEXT416(2));
  uVar2 = *(undefined4 *)(pcVar8 + lVar20 + 8);
  auVar27._4_4_ = uVar2;
  auVar27._0_4_ = uVar2;
  auVar27._8_4_ = uVar2;
  auVar27._12_4_ = uVar2;
  auVar25 = vmulps_avx512vl((undefined1  [16])aVar5,auVar27);
  auVar29 = vpermps_avx512vl(auVar33,ZEXT1632(auVar24));
  uVar2 = *(undefined4 *)(pcVar8 + lVar20 + 4);
  auVar11._4_4_ = uVar2;
  auVar11._0_4_ = uVar2;
  auVar11._8_4_ = uVar2;
  auVar11._12_4_ = uVar2;
  auVar25 = vfmadd231ps_avx512vl(auVar25,(undefined1  [16])aVar4,auVar11);
  uVar2 = *(undefined4 *)(pcVar8 + lVar20);
  auVar12._4_4_ = uVar2;
  auVar12._0_4_ = uVar2;
  auVar12._8_4_ = uVar2;
  auVar12._12_4_ = uVar2;
  auVar25 = vfmadd231ps_avx512vl(auVar25,(undefined1  [16])aVar3,auVar12);
  auVar31 = vpermps_avx512vl(auVar33,ZEXT1632(auVar25));
  uVar2 = *(undefined4 *)(pcVar8 + lVar21 + 8);
  auVar13._4_4_ = uVar2;
  auVar13._0_4_ = uVar2;
  auVar13._8_4_ = uVar2;
  auVar13._12_4_ = uVar2;
  auVar26 = vmulps_avx512vl((undefined1  [16])aVar5,auVar13);
  uVar2 = *(undefined4 *)(pcVar8 + lVar21 + 4);
  auVar14._4_4_ = uVar2;
  auVar14._0_4_ = uVar2;
  auVar14._8_4_ = uVar2;
  auVar14._12_4_ = uVar2;
  auVar26 = vfmadd231ps_avx512vl(auVar26,(undefined1  [16])aVar4,auVar14);
  uVar2 = *(undefined4 *)(pcVar8 + lVar21);
  auVar15._4_4_ = uVar2;
  auVar15._0_4_ = uVar2;
  auVar15._8_4_ = uVar2;
  auVar15._12_4_ = uVar2;
  auVar26 = vfmadd231ps_avx512vl(auVar26,(undefined1  [16])aVar3,auVar15);
  uVar2 = *(undefined4 *)(pcVar8 + lVar22 + 8);
  auVar16._4_4_ = uVar2;
  auVar16._0_4_ = uVar2;
  auVar16._8_4_ = uVar2;
  auVar16._12_4_ = uVar2;
  auVar27 = vmulps_avx512vl((undefined1  [16])aVar5,auVar16);
  uVar2 = *(undefined4 *)(pcVar8 + lVar22 + 4);
  auVar17._4_4_ = uVar2;
  auVar17._0_4_ = uVar2;
  auVar17._8_4_ = uVar2;
  auVar17._12_4_ = uVar2;
  auVar27 = vfmadd231ps_avx512vl(auVar27,(undefined1  [16])aVar4,auVar17);
  uVar2 = *(undefined4 *)(pcVar8 + lVar22);
  auVar18._4_4_ = uVar2;
  auVar18._0_4_ = uVar2;
  auVar18._8_4_ = uVar2;
  auVar18._12_4_ = uVar2;
  auVar27 = vfmadd231ps_avx512vl(auVar27,(undefined1  [16])aVar3,auVar18);
  auVar34 = vpermps_avx512vl(auVar33,ZEXT1632(auVar26));
  auVar33 = vpermps_avx512vl(auVar33,ZEXT1632(auVar27));
  auVar35 = vmulps_avx512vl(auVar33,catmullrom_basis0._3944_32_);
  auVar35 = vfmadd231ps_avx512vl(auVar35,catmullrom_basis0._2788_32_,auVar34);
  auVar35 = vfmadd231ps_avx512vl(auVar35,catmullrom_basis0._1632_32_,auVar31);
  auVar35 = vfmadd231ps_avx512vl(auVar35,catmullrom_basis0._476_32_,auVar29);
  auVar36 = vmaxps_avx512vl(auVar28,auVar35);
  auVar33 = vmulps_avx512vl(auVar33,catmullrom_basis0._8568_32_);
  auVar33 = vfmadd231ps_avx512vl(auVar33,catmullrom_basis0._7412_32_,auVar34);
  auVar33 = vfmadd231ps_avx512vl(auVar33,catmullrom_basis0._6256_32_,auVar31);
  auVar33 = vfmadd231ps_avx512vl(auVar33,catmullrom_basis0._5100_32_,auVar29);
  auVar29 = vmulps_avx512vl(auVar33,auVar30);
  auVar41 = ZEXT1232(auVar19) << 0x20;
  auVar33 = vblendps_avx(auVar29,auVar41,1);
  auVar34 = vsubps_avx512vl(auVar35,auVar33);
  auVar33 = vblendps_avx(auVar29,auVar41,0x80);
  auVar29 = vaddps_avx512vl(auVar35,auVar33);
  auVar33 = vmaxps_avx512vl(auVar34,auVar29);
  auVar36 = vmaxps_avx512vl(auVar36,auVar33);
  auVar33 = vbroadcastss_avx512vl(ZEXT416(1));
  auVar31 = vpermps_avx512vl(auVar33,ZEXT1632(auVar24));
  auVar37 = vpermps_avx512vl(auVar33,ZEXT1632(auVar25));
  auVar38 = vpermps_avx512vl(auVar33,ZEXT1632(auVar26));
  auVar33 = vpermps_avx512vl(auVar33,ZEXT1632(auVar27));
  auVar39 = vmulps_avx512vl(auVar33,catmullrom_basis0._3944_32_);
  auVar39 = vfmadd231ps_avx512vl(auVar39,catmullrom_basis0._2788_32_,auVar38);
  auVar39 = vfmadd231ps_avx512vl(auVar39,catmullrom_basis0._1632_32_,auVar37);
  auVar39 = vfmadd231ps_avx512vl(auVar39,catmullrom_basis0._476_32_,auVar31);
  auVar40 = vmaxps_avx512vl(auVar28,auVar39);
  auVar33 = vmulps_avx512vl(auVar33,catmullrom_basis0._8568_32_);
  auVar33 = vfmadd231ps_avx512vl(auVar33,catmullrom_basis0._7412_32_,auVar38);
  auVar33 = vfmadd231ps_avx512vl(auVar33,catmullrom_basis0._6256_32_,auVar37);
  auVar33 = vfmadd231ps_avx512vl(auVar33,catmullrom_basis0._5100_32_,auVar31);
  auVar31 = vmulps_avx512vl(auVar33,auVar30);
  auVar33 = vblendps_avx(auVar31,auVar41,1);
  auVar37 = vsubps_avx512vl(auVar39,auVar33);
  auVar33 = vblendps_avx(auVar31,auVar41,0x80);
  auVar38 = vaddps_avx512vl(auVar39,auVar33);
  auVar33 = vmaxps_avx512vl(auVar37,auVar38);
  auVar40 = vmaxps_avx512vl(auVar40,auVar33);
  auVar33 = vbroadcastss_avx512vl(auVar24);
  auVar31 = vbroadcastss_avx512vl(auVar25);
  auVar41 = vbroadcastss_avx512vl(auVar26);
  auVar42 = vbroadcastss_avx512vl(auVar27);
  auVar43 = vmulps_avx512vl(auVar42,catmullrom_basis0._3944_32_);
  auVar43 = vfmadd231ps_avx512vl(auVar43,auVar41,catmullrom_basis0._2788_32_);
  auVar43 = vfmadd231ps_avx512vl(auVar43,auVar31,catmullrom_basis0._1632_32_);
  auVar43 = vfmadd231ps_avx512vl(auVar43,auVar33,catmullrom_basis0._476_32_);
  auVar28 = vmaxps_avx512vl(auVar28,auVar43);
  auVar42 = vmulps_avx512vl(auVar42,catmullrom_basis0._8568_32_);
  auVar41 = vfmadd231ps_avx512vl(auVar42,catmullrom_basis0._7412_32_,auVar41);
  auVar31 = vfmadd231ps_avx512vl(auVar41,catmullrom_basis0._6256_32_,auVar31);
  auVar33 = vfmadd231ps_avx512vl(auVar31,catmullrom_basis0._5100_32_,auVar33);
  auVar30 = vmulps_avx512vl(auVar33,auVar30);
  auVar33 = vblendps_avx(auVar30,ZEXT1232(auVar19) << 0x20,1);
  auVar31 = vsubps_avx(auVar43,auVar33);
  auVar33 = vblendps_avx(auVar30,ZEXT1232(auVar19) << 0x20,0x80);
  auVar41._0_4_ = auVar43._0_4_ + auVar33._0_4_;
  auVar41._4_4_ = auVar43._4_4_ + auVar33._4_4_;
  auVar41._8_4_ = auVar43._8_4_ + auVar33._8_4_;
  auVar41._12_4_ = auVar43._12_4_ + auVar33._12_4_;
  auVar41._16_4_ = auVar43._16_4_ + auVar33._16_4_;
  auVar41._20_4_ = auVar43._20_4_ + auVar33._20_4_;
  auVar41._24_4_ = auVar43._24_4_ + auVar33._24_4_;
  auVar41._28_4_ = auVar43._28_4_ + auVar33._28_4_;
  auVar33 = vmaxps_avx(auVar31,auVar41);
  auVar33 = vmaxps_avx(auVar28,auVar33);
  auVar42._8_4_ = 0x7f800000;
  auVar42._0_8_ = 0x7f8000007f800000;
  auVar42._12_4_ = 0x7f800000;
  auVar42._16_4_ = 0x7f800000;
  auVar42._20_4_ = 0x7f800000;
  auVar42._24_4_ = 0x7f800000;
  auVar42._28_4_ = 0x7f800000;
  auVar28 = vminps_avx(auVar42,ZEXT1632(auVar46));
  auVar44 = vminps_avx(auVar44,auVar49);
  auVar28 = vminps_avx(auVar28,auVar44);
  auVar44 = vminps_avx512vl(auVar42,auVar35);
  auVar29 = vminps_avx512vl(auVar34,auVar29);
  auVar44 = vminps_avx(auVar44,auVar29);
  auVar30 = vminps_avx512vl(auVar42,auVar39);
  auVar29 = vminps_avx(auVar37,auVar38);
  auVar29 = vminps_avx(auVar30,auVar29);
  auVar30 = vminps_avx(auVar42,auVar43);
  auVar31 = vminps_avx(auVar31,auVar41);
  auVar30 = vminps_avx(auVar30,auVar31);
  auVar31 = vshufps_avx(auVar30,auVar30,0xb1);
  auVar30 = vminps_avx(auVar30,auVar31);
  auVar31 = vshufpd_avx(auVar30,auVar30,5);
  auVar30 = vminps_avx(auVar30,auVar31);
  auVar46 = vminps_avx(auVar30._0_16_,auVar30._16_16_);
  auVar30 = vshufps_avx(auVar29,auVar29,0xb1);
  auVar29 = vminps_avx(auVar29,auVar30);
  auVar30 = vshufpd_avx(auVar29,auVar29,5);
  auVar29 = vminps_avx(auVar29,auVar30);
  auVar24 = vminps_avx(auVar29._0_16_,auVar29._16_16_);
  auVar24 = vunpcklps_avx(auVar46,auVar24);
  auVar29 = vshufps_avx(auVar44,auVar44,0xb1);
  auVar44 = vminps_avx(auVar44,auVar29);
  auVar29 = vshufpd_avx(auVar44,auVar44,5);
  auVar44 = vminps_avx(auVar44,auVar29);
  auVar46 = vminps_avx(auVar44._0_16_,auVar44._16_16_);
  auVar25 = vinsertps_avx(auVar24,auVar46,0x28);
  auVar44 = vshufps_avx(auVar33,auVar33,0xb1);
  auVar33 = vmaxps_avx(auVar33,auVar44);
  auVar44 = vshufpd_avx(auVar33,auVar33,5);
  auVar33 = vmaxps_avx(auVar33,auVar44);
  auVar46 = vmaxps_avx(auVar33._0_16_,auVar33._16_16_);
  auVar33 = vshufps_avx512vl(auVar40,auVar40,0xb1);
  auVar44 = vmaxps_avx512vl(auVar40,auVar33);
  auVar33 = vshufpd_avx(auVar44,auVar44,5);
  auVar33 = vmaxps_avx(auVar44,auVar33);
  auVar24 = vmaxps_avx(auVar33._0_16_,auVar33._16_16_);
  auVar24 = vunpcklps_avx(auVar46,auVar24);
  auVar33 = vshufps_avx(auVar36,auVar36,0xb1);
  auVar33 = vmaxps_avx(auVar36,auVar33);
  auVar44 = vshufpd_avx(auVar33,auVar33,5);
  auVar33 = vmaxps_avx(auVar33,auVar44);
  auVar46 = vmaxps_avx(auVar33._0_16_,auVar33._16_16_);
  auVar26 = vinsertps_avx(auVar24,auVar46,0x28);
  auVar33 = vshufps_avx(auVar28,auVar28,0xb1);
  auVar33 = vminps_avx(auVar28,auVar33);
  auVar28 = vshufpd_avx(auVar33,auVar33,5);
  auVar33 = vminps_avx(auVar33,auVar28);
  auVar46 = vminss_avx(auVar33._0_16_,auVar33._16_16_);
  auVar33 = vshufps_avx512vl(auVar32,auVar32,0xb1);
  auVar28 = vmaxps_avx512vl(auVar32,auVar33);
  auVar33 = vshufpd_avx(auVar28,auVar28,5);
  auVar33 = vmaxps_avx(auVar28,auVar33);
  auVar24 = vmaxss_avx(auVar33._0_16_,auVar33._16_16_);
  auVar48._8_4_ = 0x7fffffff;
  auVar48._0_8_ = 0x7fffffff7fffffff;
  auVar48._12_4_ = 0x7fffffff;
  auVar46 = vandps_avx(auVar46,auVar48);
  auVar24 = vandps_avx(auVar24,auVar48);
  auVar46 = vmaxss_avx(auVar24,auVar46);
  auVar46._4_4_ = auVar46._0_4_;
  auVar46._8_4_ = auVar46._0_4_;
  auVar46._12_4_ = auVar46._0_4_;
  auVar25 = vsubps_avx(auVar25,auVar46);
  auVar45._0_4_ = auVar26._0_4_ + auVar46._0_4_;
  auVar45._4_4_ = auVar26._4_4_ + auVar46._0_4_;
  auVar45._8_4_ = auVar26._8_4_ + auVar46._0_4_;
  auVar45._12_4_ = auVar26._12_4_ + auVar46._0_4_;
  auVar46 = vandps_avx(auVar25,auVar48);
  auVar24 = vandps_avx(auVar45,auVar48);
  auVar46 = vmaxps_avx(auVar46,auVar24);
  auVar24 = vmovshdup_avx(auVar46);
  auVar24 = vmaxss_avx(auVar24,auVar46);
  auVar46 = vshufpd_avx(auVar46,auVar46,1);
  auVar46 = vmaxss_avx(auVar46,auVar24);
  fVar1 = auVar46._0_4_ * 4.7683716e-07;
  auVar47._4_4_ = fVar1;
  auVar47._0_4_ = fVar1;
  auVar47._8_4_ = fVar1;
  auVar47._12_4_ = fVar1;
  aVar3 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vsubps_avx(auVar25,auVar47);
  (__return_storage_ptr__->lower).field_0 = aVar3;
  (__return_storage_ptr__->upper).field_0.m128[0] = auVar45._0_4_ + fVar1;
  (__return_storage_ptr__->upper).field_0.m128[1] = auVar45._4_4_ + fVar1;
  (__return_storage_ptr__->upper).field_0.m128[2] = auVar45._8_4_ + fVar1;
  (__return_storage_ptr__->upper).field_0.m128[3] = auVar45._12_4_ + fVar1;
  return __return_storage_ptr__;
}

Assistant:

BBox3fa vbounds(const LinearSpace3fa& space, size_t i) const {
        return bounds(space,i);
      }